

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

int Parser_processAttribute(Parser *xmlParser,IXML_Node *node)

{
  Nodeptr p_Var1;
  int iVar2;
  char *pcVar3;
  ptrdiff_t pVar4;
  char *pCurToken;
  char *pCur;
  char *strEndQuote;
  ptrdiff_t tlen;
  int line;
  int ret;
  IXML_Node *node_local;
  Parser *xmlParser_local;
  
  tlen._4_4_ = 0;
  tlen._0_4_ = 0;
  strEndQuote = (char *)0x0;
  _line = node;
  node_local = (IXML_Node *)xmlParser;
  if (xmlParser == (Parser *)0x0) {
    __assert_fail("xmlParser",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                  ,0x777,"int Parser_processAttribute(Parser *, IXML_Node *)");
  }
  if (xmlParser == (Parser *)0x0) {
    tlen._4_4_ = 0x6a;
    tlen._0_4_ = 0x77b;
  }
  else {
    pcVar3 = (xmlParser->tokenBuf).buf;
    if (pcVar3 == (char *)0x0) {
      tlen._4_4_ = 0xc;
      tlen._0_4_ = 0x781;
    }
    else {
      iVar2 = Parser_UTF8ToInt(pcVar3,(ptrdiff_t *)&strEndQuote);
      iVar2 = Parser_isNameChar(iVar2,0);
      if (iVar2 == 0) {
        tlen._4_4_ = 0xc;
        tlen._0_4_ = 0x786;
      }
      else {
        pcVar3 = safe_strdup(pcVar3);
        _line->nodeName = pcVar3;
        if (_line->nodeName == (char *)0x0) {
          tlen._4_4_ = 0x66;
          tlen._0_4_ = 0x78d;
        }
        else {
          pVar4 = Parser_getNextToken((Parser *)node_local);
          if (pVar4 == 0) {
            tlen._4_4_ = 0xc;
            tlen._0_4_ = 0x793;
          }
          else if (*(char *)&node_local->parentNode->nodeName == '=') {
            pVar4 = Parser_getNextToken((Parser *)node_local);
            if (pVar4 == 0) {
              tlen._4_4_ = 0xc;
              tlen._0_4_ = 0x7a0;
            }
            else {
              p_Var1 = node_local->parentNode;
              if ((*(char *)&p_Var1->nodeName == '\"') || (*(char *)&p_Var1->nodeName == '\'')) {
                pcVar3 = strstr(node_local->nodeValue,(char *)p_Var1);
                if (pcVar3 == (char *)0x0) {
                  tlen._4_4_ = 0xc;
                  tlen._0_4_ = 0x7ad;
                }
                else {
                  for (pCurToken = node_local->nodeValue; pCurToken < pcVar3;
                      pCurToken = pCurToken + 1) {
                    if (*pCurToken == '<') {
                      tlen._4_4_ = 0xc;
                      tlen._0_4_ = 0x7b6;
                      goto LAB_0013cf5b;
                    }
                  }
                  Parser_clearTokenBuf((Parser *)node_local);
                  if (pcVar3 != node_local->nodeValue) {
                    iVar2 = Parser_copyToken((Parser *)node_local,node_local->nodeValue,
                                             (long)pcVar3 - (long)node_local->nodeValue);
                    if (iVar2 != 0) {
                      tlen._4_4_ = 0xc;
                      tlen._0_4_ = 0x7c6;
                      goto LAB_0013cf5b;
                    }
                    tlen._4_4_ = 0;
                  }
                  node_local->nodeValue = pcVar3 + 1;
                  if (node_local->parentNode == (Nodeptr)0x0) {
                    pcVar3 = (char *)malloc(1);
                    _line->nodeValue = pcVar3;
                    *_line->nodeValue = '\0';
                  }
                  else {
                    pcVar3 = safe_strdup((char *)node_local->parentNode);
                    _line->nodeValue = pcVar3;
                    if (_line->nodeValue == (char *)0x0) {
                      tlen._4_4_ = 0x66;
                      tlen._0_4_ = 0x7d2;
                      goto LAB_0013cf5b;
                    }
                  }
                  _line->nodeType = eATTRIBUTE_NODE;
                  tlen._4_4_ = Parser_xmlNamespace((Parser *)node_local,_line);
                  if (tlen._4_4_ == 0) {
                    *(char **)&node_local->nodeType = node_local->nodeValue;
                    pVar4 = Parser_getNextToken((Parser *)node_local);
                    if (pVar4 == 0) {
                      tlen._4_4_ = 0xc;
                      tlen._0_4_ = 0x7e7;
                    }
                    else {
                      p_Var1 = node_local->parentNode;
                      iVar2 = strcmp((char *)p_Var1,"<");
                      if (iVar2 == 0) {
                        tlen._4_4_ = 0x6a;
                        tlen._0_4_ = 0x7ee;
                      }
                      else {
                        iVar2 = strcmp((char *)p_Var1,">");
                        if (iVar2 == 0) {
                          *(undefined4 *)&node_local[1].nodeName = 2;
                        }
                        else {
                          node_local->nodeValue = *(char **)&node_local->nodeType;
                        }
                      }
                    }
                  }
                  else {
                    tlen._0_4_ = 0x7e0;
                  }
                }
              }
              else {
                tlen._4_4_ = 0xc;
                tlen._0_4_ = 0x7a7;
              }
            }
          }
          else {
            tlen._4_4_ = 0xc;
            tlen._0_4_ = 0x79a;
          }
        }
      }
    }
  }
LAB_0013cf5b:
  if ((tlen._4_4_ != 0) && (tlen._4_4_ != 0x68)) {
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,(int)tlen,"Parser_processAttribute","Error %d\n",(ulong)tlen._4_4_);
  }
  return tlen._4_4_;
}

Assistant:

static int Parser_processAttribute(
	/*! [in] The XML parser. */
	Parser *xmlParser,
	/*! [in] The Node to process. */
	IXML_Node *node)
{
	int ret = IXML_SUCCESS;
	int line = 0;
	ptrdiff_t tlen = 0;
	char *strEndQuote = NULL;
	char *pCur = NULL;
	char *pCurToken = NULL;

	assert(xmlParser);

	if (xmlParser == NULL) {
		ret = IXML_FAILED;
		line = __LINE__;
		goto ExitFunction;
	}
	pCurToken = xmlParser->tokenBuf.buf;
	if (pCurToken == NULL) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	if (Parser_isNameChar(Parser_UTF8ToInt(pCurToken, &tlen), 0) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* copy in the attribute name */
	node->nodeName = safe_strdup(pCurToken);
	if (node->nodeName == NULL) {
		ret = IXML_INSUFFICIENT_MEMORY;
		line = __LINE__;
		goto ExitFunction;
	}
	/* read in the "=" sign */
	if (Parser_getNextToken(xmlParser) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}

	pCurToken = xmlParser->tokenBuf.buf;
	if (*pCurToken != EQUALS) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* read in the single quote or double quote */
	if (Parser_getNextToken(xmlParser) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* pCurToken is either quote or single quote */
	pCurToken = (xmlParser->tokenBuf).buf;
	if (*pCurToken != QUOTE && *pCurToken != SINGLEQUOTE) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	strEndQuote = strstr(xmlParser->curPtr, pCurToken);
	if (strEndQuote == NULL) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* check between curPtr and strEndQuote,
	 * whether there are illegal chars. */
	pCur = xmlParser->curPtr;
	while (pCur < strEndQuote) {
		if (*pCur == '<') {
			ret = IXML_SYNTAX_ERR;
			line = __LINE__;
			goto ExitFunction;
		}
		/*if (*pCur == '&') {
			Parser_parseReference(++pCur);
		}*/
		pCur++;
	}
	/* clear token buffer */
	Parser_clearTokenBuf(xmlParser);
	if (strEndQuote != xmlParser->curPtr) {
		ret = Parser_copyToken(xmlParser,
			xmlParser->curPtr,
			strEndQuote - xmlParser->curPtr);
		if (ret != IXML_SUCCESS) {
			ret = IXML_SYNTAX_ERR;
			line = __LINE__;
			goto ExitFunction;
		}
	}
	/* skip the ending quote */
	xmlParser->curPtr = strEndQuote + 1;
	pCurToken = xmlParser->tokenBuf.buf;
	if (pCurToken != NULL) {
		/* attribute has value, like a="c" */
		node->nodeValue = safe_strdup(pCurToken);
		if (node->nodeValue == NULL) {
			ret = IXML_INSUFFICIENT_MEMORY;
			line = __LINE__;
			goto ExitFunction;
		}
	} else {
		/* if attribute doesn't have value, like a=""
		 * somewhere on other places is this copied */
		node->nodeValue = malloc(sizeof(char));
		*(node->nodeValue) = '\0';
	}
	node->nodeType = eATTRIBUTE_NODE;

	/* check whether this is a new namespace definition */
	ret = Parser_xmlNamespace(xmlParser, node);
	if (ret != IXML_SUCCESS) {
		line = __LINE__;
		goto ExitFunction;
	}
	/* read ahead to see whether we have more attributes */
	xmlParser->savePtr = xmlParser->curPtr;
	if (Parser_getNextToken(xmlParser) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}

	pCurToken = xmlParser->tokenBuf.buf;
	if (strcmp(pCurToken, "<") == 0) {
		ret = IXML_FAILED;
		line = __LINE__;
		goto ExitFunction;
	} else if (strcmp(pCurToken, ">") != 0) {
		/* more attribute? */
		/* backup */
		xmlParser->curPtr = xmlParser->savePtr;
	} else {
		xmlParser->state = eCONTENT;
	}

ExitFunction:
	if (ret != IXML_SUCCESS && ret != IXML_FILE_DONE) {
		IxmlPrintf(__FILE__,
			line,
			"Parser_processAttribute",
			"Error %d\n",
			ret);
	}

	return ret;
}